

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffuptf(fitsfile *fptr,int *status)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  long rownum;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  LONGLONG naxis2;
  LONGLONG length;
  long tflds;
  byte local_288;
  byte bStack_287;
  byte bStack_286;
  byte bStack_285;
  byte bStack_284;
  byte bStack_283;
  byte bStack_282;
  byte bStack_281;
  byte bStack_280;
  byte bStack_27f;
  byte bStack_27e;
  byte bStack_27d;
  byte bStack_27c;
  byte bStack_27b;
  byte bStack_27a;
  byte bStack_279;
  byte local_278;
  byte bStack_277;
  byte bStack_276;
  byte bStack_275;
  byte bStack_274;
  byte bStack_273;
  byte bStack_272;
  byte bStack_271;
  byte bStack_270;
  byte bStack_26f;
  byte bStack_26e;
  byte bStack_26d;
  byte bStack_26c;
  byte bStack_26b;
  byte bStack_26a;
  byte bStack_269;
  LONGLONG addr;
  char newform [71];
  char tform [71];
  char comment [73];
  char keyname [75];
  char lenval [40];
  char message [81];
  char card [81];
  
  ffmaky(fptr,2,status);
  ffgkyjj(fptr,"NAXIS2",&naxis2,comment,status);
  ffgkyj(fptr,"TFIELDS",&tflds,comment,status);
  lVar6 = 1;
  local_278 = 0xfe;
  bStack_277 = 0xfe;
  bStack_276 = 0xfe;
  bStack_275 = 0xfe;
  bStack_274 = 0;
  bStack_273 = 0;
  bStack_272 = 0;
  bStack_271 = 0;
  bStack_270 = 0;
  bStack_26f = 0;
  bStack_26e = 0;
  bStack_26d = 0;
  bStack_26c = 0;
  bStack_26b = 0;
  bStack_26a = 0;
  bStack_269 = 0;
  local_288 = 0x50;
  bStack_287 = 0x50;
  bStack_286 = 0x50;
  bStack_285 = 0x50;
  bStack_284 = 0;
  bStack_283 = 0;
  bStack_282 = 0;
  bStack_281 = 0;
  bStack_280 = 0;
  bStack_27f = 0;
  bStack_27e = 0;
  bStack_27d = 0;
  bStack_27c = 0;
  bStack_27b = 0;
  bStack_27a = 0;
  bStack_279 = 0;
  do {
    if (tflds < lVar6) {
LAB_0014142b:
      return *status;
    }
    ffkeyn("TFORM",(int)lVar6,keyname,status);
    iVar1 = ffgkys(fptr,keyname,tform,comment,status);
    if (0 < iVar1) {
      memcpy(message,"Error while updating variable length vector TFORMn values (ffuptf).",0x44);
      ffpmsg(message);
      goto LAB_0014142b;
    }
    auVar7[0] = -((tform[0] & local_278) == local_288);
    auVar7[1] = -((tform[0] & bStack_277) == bStack_287);
    auVar7[2] = -((tform[1] & bStack_276) == bStack_286);
    auVar7[3] = -((tform[1] & bStack_275) == bStack_285);
    auVar7[4] = -((tform[2] & bStack_274) == bStack_284);
    auVar7[5] = -((tform[2] & bStack_273) == bStack_283);
    auVar7[6] = -((tform[3] & bStack_272) == bStack_282);
    auVar7[7] = -((tform[3] & bStack_271) == bStack_281);
    auVar7[8] = -((tform[4] & bStack_270) == bStack_280);
    auVar7[9] = -((tform[4] & bStack_26f) == bStack_27f);
    auVar7[10] = -((tform[5] & bStack_26e) == bStack_27e);
    auVar7[0xb] = -((tform[5] & bStack_26d) == bStack_27d);
    auVar7[0xc] = -((tform[6] & bStack_26c) == bStack_27c);
    auVar7[0xd] = -((tform[6] & bStack_26b) == bStack_27b);
    auVar7[0xe] = -((tform[7] & bStack_26a) == bStack_27a);
    auVar7[0xf] = -((tform[7] & bStack_269) == bStack_279);
    auVar7 = pshuflw(auVar7,auVar7,0x50);
    auVar8._0_4_ = auVar7._0_4_;
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = auVar7._4_4_;
    auVar8._12_4_ = auVar7._4_4_;
    iVar1 = movmskpd(iVar1,auVar8);
    if (iVar1 != 0) {
      lVar5 = 0;
      for (rownum = 1; rownum <= naxis2; rownum = rownum + 1) {
        ffgdesll(fptr,(int)lVar6,rownum,&length,&addr,status);
        if (lVar5 < length) {
          lVar5 = length;
        }
      }
      newform[0] = '\'';
      newform[1] = '\0';
      pcVar2 = strchr(tform,0x28);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      sVar3 = strlen(tform);
      snprintf(lenval,0x28,"(%.0f)",(double)lVar5);
      sVar4 = strlen(lenval);
      if ((sVar4 + (long)(int)sVar3) - 0x45 < 0xffffffffffffffb9) {
        ffpmsg("Error assembling TFORMn string (ffuptf).");
        *status = 0x105;
        return 0x105;
      }
      strcat(newform,tform);
      strcat(newform,lenval);
      while( true ) {
        sVar3 = strlen(newform);
        sVar4 = strlen(newform);
        if (8 < sVar3) break;
        (newform + sVar4)[0] = ' ';
        (newform + sVar4)[1] = '\0';
      }
      (newform + sVar4)[0] = '\'';
      (newform + sVar4)[1] = '\0';
      ffmkky(keyname,newform,comment,card,status);
      ffmkey(fptr,card,status);
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

int ffuptf(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  Update the value of the TFORM keywords for the variable length array
  columns to make sure they all have the form 1Px(len) or Px(len) where
  'len' is the maximum length of the vector in the table (e.g., '1PE(400)')
*/
{
    int ii, lenform=0;
    long tflds;
    LONGLONG length, addr, maxlen, naxis2, jj;
    char comment[FLEN_COMMENT], keyname[FLEN_KEYWORD];
    char tform[FLEN_VALUE], newform[FLEN_VALUE], lenval[40];
    char card[FLEN_CARD];
    char message[FLEN_ERRMSG];
    char *tmp;

    ffmaky(fptr, 2, status);         /* reset to beginning of header */
    ffgkyjj(fptr, "NAXIS2", &naxis2, comment, status);
    ffgkyj(fptr, "TFIELDS", &tflds, comment, status);

    for (ii = 1; ii <= tflds; ii++)        /* loop over all the columns */
    {
      ffkeyn("TFORM", ii, keyname, status);          /* construct name */
      if (ffgkys(fptr, keyname, tform, comment, status) > 0)
      {
        snprintf(message,FLEN_ERRMSG,
        "Error while updating variable length vector TFORMn values (ffuptf).");
        ffpmsg(message);
        return(*status);
      }
      /* is this a variable array length column ? */
      if (tform[0] == 'P' || tform[1] == 'P' || tform[0] == 'Q' || tform[1] == 'Q')
      {
          /* get the max length */
          maxlen = 0;
          for (jj=1; jj <= naxis2; jj++)
          {
            ffgdesll(fptr, ii, jj, &length, &addr, status);

	    if (length > maxlen)
	         maxlen = length;
          }

          /* construct the new keyword value */
          strcpy(newform, "'");
          tmp = strchr(tform, '(');  /* truncate old length, if present */
          if (tmp) *tmp = 0;
          lenform = strlen(tform);

          /* print as double, because the string-to-64-bit */
          /* conversion is platform dependent (%lld, %ld, %I64d) */

          snprintf(lenval,40, "(%.0f)", (double) maxlen);
          
          if (lenform+strlen(lenval)+2 > FLEN_VALUE-1)
          {
             ffpmsg("Error assembling TFORMn string (ffuptf).");
             return(*status = BAD_TFORM);
          }
          strcat(newform, tform);

          strcat(newform,lenval);
          while(strlen(newform) < 9)
             strcat(newform," ");   /* append spaces 'till length = 8 */
          strcat(newform,"'" );     /* append closing parenthesis */
          /* would be simpler to just call ffmkyj here, but this */
          /* would force linking in all the modkey & putkey routines */
          ffmkky(keyname, newform, comment, card, status);  /* make new card */
          ffmkey(fptr, card, status);   /* replace last read keyword */
      }
    }
    return(*status);
}